

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O0

void __thiscall
checker_texture::checker_texture(checker_texture *this,double scale,color *c1,color *c2)

{
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  color *local_28;
  color *c2_local;
  color *c1_local;
  double scale_local;
  checker_texture *this_local;
  
  local_28 = c2;
  c2_local = c1;
  c1_local = (color *)scale;
  scale_local = (double)this;
  std::make_shared<solid_color,vec3_const&>((vec3 *)local_48);
  std::shared_ptr<texture>::shared_ptr<solid_color,void>
            ((shared_ptr<texture> *)(local_48 + 0x10),(shared_ptr<solid_color> *)local_48);
  std::make_shared<solid_color,vec3_const&>((vec3 *)local_68);
  std::shared_ptr<texture>::shared_ptr<solid_color,void>
            ((shared_ptr<texture> *)(local_68 + 0x10),(shared_ptr<solid_color> *)local_68);
  checker_texture(this,scale,(shared_ptr<texture> *)(local_48 + 0x10),
                  (shared_ptr<texture> *)(local_68 + 0x10));
  std::shared_ptr<texture>::~shared_ptr((shared_ptr<texture> *)(local_68 + 0x10));
  std::shared_ptr<solid_color>::~shared_ptr((shared_ptr<solid_color> *)local_68);
  std::shared_ptr<texture>::~shared_ptr((shared_ptr<texture> *)(local_48 + 0x10));
  std::shared_ptr<solid_color>::~shared_ptr((shared_ptr<solid_color> *)local_48);
  return;
}

Assistant:

checker_texture(double scale, const color& c1, const color& c2)
      : checker_texture(scale, make_shared<solid_color>(c1), make_shared<solid_color>(c2)) {}